

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ExpressionTemplateTest::arithmeticOperatorsTest(ExpressionTemplateTest *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  value_type vVar6;
  value_type vVar7;
  value_type vVar8;
  value_type vVar9;
  value_type vVar10;
  value_type vVar11;
  value_type vVar12;
  value_type vVar13;
  value_type vVar14;
  value_type vVar15;
  value_type vVar16;
  value_type vVar17;
  value_type vVar18;
  ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *pVVar19;
  int *piVar20;
  reference piVar21;
  uint *puVar22;
  ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *expression;
  andres *this_00;
  BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  BVar23;
  BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  BVar24;
  BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
  BVar25;
  BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
  BVar26;
  BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
  BVar27;
  BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
  BVar28;
  BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
  BVar29;
  BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
  BVar30;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_3a0;
  undefined5 local_388;
  undefined3 uStack_383;
  scalar_type_conflict local_380;
  undefined1 uStack_37c;
  int local_374;
  undefined5 local_370;
  undefined3 local_36b;
  undefined5 uStack_368;
  BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_360;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_348;
  BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
  local_330;
  BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  local_318;
  bool local_2f9;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
  local_2f8;
  bool local_2d9;
  undefined5 local_2d8;
  undefined3 uStack_2d3;
  scalar_type_conflict local_2d0;
  undefined1 uStack_2cc;
  int local_2c4;
  BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
  local_2c0;
  bool local_2a9;
  undefined5 local_2a8;
  undefined3 uStack_2a3;
  scalar_type_conflict local_2a0;
  undefined1 uStack_29c;
  int local_294;
  BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
  local_290;
  bool local_279;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_278;
  bool local_259;
  undefined5 local_258;
  undefined3 uStack_253;
  scalar_type_conflict local_250;
  undefined1 uStack_24c;
  int local_244;
  BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_240;
  bool local_229;
  undefined5 local_228;
  undefined3 uStack_223;
  scalar_type_conflict local_220;
  undefined1 uStack_21c;
  int local_214;
  BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_210;
  bool local_1f9;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
  local_1f8;
  bool local_1d9;
  undefined5 local_1d8;
  undefined3 uStack_1d3;
  scalar_type_conflict local_1d0;
  undefined1 uStack_1cc;
  int local_1c4;
  BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
  local_1c0;
  bool local_1a9;
  undefined5 local_1a8;
  undefined3 uStack_1a3;
  scalar_type_conflict local_1a0;
  undefined1 uStack_19c;
  int local_194;
  BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
  local_190;
  bool local_179;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  local_178;
  bool local_159;
  undefined5 local_158;
  undefined3 uStack_153;
  scalar_type_conflict local_150;
  undefined1 uStack_14c;
  int local_144;
  BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  local_140;
  bool local_129;
  undefined5 local_128;
  undefined3 uStack_123;
  scalar_type_conflict local_120;
  undefined1 uStack_11c;
  int local_114;
  BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  local_110;
  bool local_f9;
  UnaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
  local_f8;
  bool local_e2;
  bool local_e1;
  andres *local_e0;
  size_t x;
  size_t y;
  size_t z;
  undefined1 local_c0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w;
  allocator<int> local_69;
  undefined1 local_68 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  size_t shape [3];
  ExpressionTemplateTest *this_local;
  
  v.geometry_.coordinateOrder_ = 2;
  v.geometry_.isSimple_ = false;
  v.geometry_._53_3_ = 0;
  shape[0] = 3;
  shape[1] = 2;
  shape[2] = (size_t)this;
  std::allocator<int>::allocator(&local_69);
  andres::View<int,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
             (unsigned_long *)&v.geometry_.coordinateOrder_,shape + 2,this->dataInt_,
             &andres::defaultOrder,&andres::defaultOrder,&local_69);
  std::allocator<int>::~allocator(&local_69);
  std::allocator<int>::allocator((allocator<int> *)((long)&z + 7));
  pVVar19 = (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
            &v.geometry_.coordinateOrder_;
  andres::View<int,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<int,false,std::allocator<unsigned_long>> *)local_c0,(unsigned_long *)pVVar19,
             shape + 2,this->dataInt_ + 2,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&z + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&z + 7));
  for (y = 0; y < 2; y = y + 1) {
    for (x = 0; x < 3; x = x + 1) {
      for (local_e0 = (andres *)0x0; local_e0 < (andres *)0x2; local_e0 = local_e0 + 1) {
        pVVar19 = andres::operator+((andres *)local_68,pVVar19);
        piVar20 = andres::
                  ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>::
                  operator()(pVVar19,(size_t)local_e0,x,y);
        iVar5 = *piVar20;
        this_00 = local_e0;
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        local_e1 = iVar5 == *piVar21;
        test(&local_e1);
        local_f8.e_ = (View<int,_false,_std::allocator<unsigned_long>_> *)
                      andres::operator-((UnaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                                         *)local_68,this_00,expression);
        iVar5 = andres::
                UnaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                ::operator()(&local_f8,(size_t)local_e0,x,y);
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        local_e2 = iVar5 + *piVar21 == 0;
        test(&local_e2);
        local_114 = 2;
        BVar23 = andres::operator+(&local_114,
                                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                                    *)local_68);
        local_120 = BVar23.scalar_;
        local_128 = BVar23.e_._0_5_;
        uStack_123 = BVar23.e_._5_3_;
        local_110._8_5_ = SUB85(CONCAT17(uStack_11c,BVar23._5_7_) >> 0x18,0);
        local_110.e_._0_5_ = local_128;
        local_110.e_._5_3_ = uStack_123;
        vVar6 = andres::
                BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                ::operator()(&local_110,(size_t)local_e0,x,y);
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        local_f9 = vVar6 == *piVar21 + 2;
        test(&local_f9);
        local_144 = 2;
        BVar24 = andres::operator+((ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                                    *)local_68,&local_144);
        local_150 = BVar24.scalar_;
        local_158 = BVar24.e_._0_5_;
        uStack_153 = BVar24.e_._5_3_;
        local_140._8_5_ = SUB85(CONCAT17(uStack_14c,BVar24._5_7_) >> 0x18,0);
        local_140.e_._0_5_ = local_158;
        local_140.e_._5_3_ = uStack_153;
        vVar7 = andres::
                BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                ::operator()(&local_140,(size_t)local_e0,x,y);
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        local_129 = vVar7 == *piVar21 + 2;
        test(&local_129);
        andres::operator+(&local_178,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_68,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_c0);
        vVar8 = andres::
                BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                ::operator()(&local_178,(size_t)local_e0,x,y);
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        iVar5 = *piVar21;
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_c0,
                             (size_t)local_e0,x,y);
        local_159 = vVar8 == iVar5 + *piVar21;
        test(&local_159);
        local_194 = 2;
        BVar25 = andres::operator-(&local_194,
                                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                                    *)local_68);
        local_1a0 = BVar25.scalar_;
        local_1a8 = BVar25.e_._0_5_;
        uStack_1a3 = BVar25.e_._5_3_;
        local_190._8_5_ = SUB85(CONCAT17(uStack_19c,BVar25._5_7_) >> 0x18,0);
        local_190.e_._0_5_ = local_1a8;
        local_190.e_._5_3_ = uStack_1a3;
        vVar9 = andres::
                BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                ::operator()(&local_190,(size_t)local_e0,x,y);
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        local_179 = vVar9 == 2 - *piVar21;
        test(&local_179);
        local_1c4 = 2;
        BVar26 = andres::operator-((ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                                    *)local_68,&local_1c4);
        local_1d0 = BVar26.scalar_;
        local_1d8 = BVar26.e_._0_5_;
        uStack_1d3 = BVar26.e_._5_3_;
        local_1c0._8_5_ = SUB85(CONCAT17(uStack_1cc,BVar26._5_7_) >> 0x18,0);
        local_1c0.e_._0_5_ = local_1d8;
        local_1c0.e_._5_3_ = uStack_1d3;
        vVar10 = andres::
                 BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                 ::operator()(&local_1c0,(size_t)local_e0,x,y);
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        local_1a9 = vVar10 == *piVar21 + -2;
        test(&local_1a9);
        andres::operator-(&local_1f8,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_68,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_c0);
        vVar11 = andres::
                 BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                 ::operator()(&local_1f8,(size_t)local_e0,x,y);
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        iVar5 = *piVar21;
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_c0,
                             (size_t)local_e0,x,y);
        local_1d9 = vVar11 == iVar5 - *piVar21;
        test(&local_1d9);
        local_214 = 2;
        BVar27 = andres::operator*(&local_214,
                                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                                    *)local_68);
        local_220 = BVar27.scalar_;
        local_228 = BVar27.e_._0_5_;
        uStack_223 = BVar27.e_._5_3_;
        local_210._8_5_ = SUB85(CONCAT17(uStack_21c,BVar27._5_7_) >> 0x18,0);
        local_210.e_._0_5_ = local_228;
        local_210.e_._5_3_ = uStack_223;
        vVar12 = andres::
                 BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                 ::operator()(&local_210,(size_t)local_e0,x,y);
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        local_1f9 = vVar12 + *piVar21 * -2 == 0;
        test(&local_1f9);
        local_244 = 2;
        BVar28 = andres::operator*((ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                                    *)local_68,&local_244);
        local_250 = BVar28.scalar_;
        local_258 = BVar28.e_._0_5_;
        uStack_253 = BVar28.e_._5_3_;
        local_240._8_5_ = SUB85(CONCAT17(uStack_24c,BVar28._5_7_) >> 0x18,0);
        local_240.e_._0_5_ = local_258;
        local_240.e_._5_3_ = uStack_253;
        vVar13 = andres::
                 BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                 ::operator()(&local_240,(size_t)local_e0,x,y);
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        local_229 = vVar13 + *piVar21 * -2 == 0;
        test(&local_229);
        andres::operator*(&local_278,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_68,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_c0);
        vVar14 = andres::
                 BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                 ::operator()(&local_278,(size_t)local_e0,x,y);
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        iVar5 = *piVar21;
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_c0,
                             (size_t)local_e0,x,y);
        local_259 = vVar14 == iVar5 * *piVar21;
        test(&local_259);
        local_294 = 2;
        BVar29 = andres::operator/(&local_294,
                                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                                    *)local_68);
        local_2a0 = BVar29.scalar_;
        local_2a8 = BVar29.e_._0_5_;
        uStack_2a3 = BVar29.e_._5_3_;
        local_290._8_5_ = SUB85(CONCAT17(uStack_29c,BVar29._5_7_) >> 0x18,0);
        local_290.e_._0_5_ = local_2a8;
        local_290.e_._5_3_ = uStack_2a3;
        vVar15 = andres::
                 BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                 ::operator()(&local_290,(size_t)local_e0,x,y);
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        local_279 = vVar15 == (int)(2 / (long)*piVar21);
        test(&local_279);
        local_2c4 = 2;
        BVar30 = andres::operator/((ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                                    *)local_68,&local_2c4);
        local_2d0 = BVar30.scalar_;
        local_2d8 = BVar30.e_._0_5_;
        uStack_2d3 = BVar30.e_._5_3_;
        local_2c0._8_5_ = SUB85(CONCAT17(uStack_2cc,BVar30._5_7_) >> 0x18,0);
        local_2c0.e_._0_5_ = local_2d8;
        local_2c0.e_._5_3_ = uStack_2d3;
        vVar16 = andres::
                 BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                 ::operator()(&local_2c0,(size_t)local_e0,x,y);
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        local_2a9 = vVar16 == *piVar21 / 2;
        test(&local_2a9);
        andres::operator/(&local_2f8,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_68,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_c0);
        vVar17 = andres::
                 BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                 ::operator()(&local_2f8,(size_t)local_e0,x,y);
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        iVar5 = *piVar21;
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_c0,
                             (size_t)local_e0,x,y);
        local_2d9 = vVar17 == iVar5 / *piVar21;
        test(&local_2d9);
        andres::operator*(&local_348,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_68,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_68);
        local_374 = 2;
        BVar27 = andres::operator*(&local_374,
                                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                                    *)local_68);
        local_380 = BVar27.scalar_;
        local_388 = BVar27.e_._0_5_;
        uStack_383 = BVar27.e_._5_3_;
        uStack_368 = (undefined5)(CONCAT17(uStack_37c,BVar27._5_7_) >> 0x18);
        local_370 = local_388;
        local_36b = uStack_383;
        andres::operator*(&local_360,
                          (ViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                           *)&local_370,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_c0);
        andres::operator-(&local_330,
                          (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                           *)&local_348,
                          (ViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                           *)&local_360);
        andres::operator*(&local_3a0,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_c0,
                          (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                           *)local_c0);
        andres::operator+(&local_318,
                          (ViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int>
                           *)&local_330,
                          (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                           *)&local_3a0);
        vVar18 = andres::
                 BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                 ::operator()(&local_318,(size_t)local_e0,x,y);
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        iVar5 = *piVar21;
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        iVar1 = *piVar21;
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_68,
                             (size_t)local_e0,x,y);
        iVar2 = *piVar21;
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_c0,
                             (size_t)local_e0,x,y);
        iVar3 = *piVar21;
        piVar21 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_c0,
                             (size_t)local_e0,x,y);
        iVar4 = *piVar21;
        puVar22 = (uint *)andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                    ((View<int,false,std::allocator<unsigned_long>> *)local_c0,
                                     (size_t)local_e0,x,y);
        pVVar19 = (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                  (ulong)*puVar22;
        local_2f9 = vVar18 == (iVar5 * iVar1 - iVar2 * 2 * iVar3) + iVar4 * *puVar22;
        test(&local_2f9);
      }
    }
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_68);
  return;
}

Assistant:

void ExpressionTemplateTest::arithmeticOperatorsTest()
{
    std::size_t shape[] = {2, 3, 2};
    andres::View<int> v(shape, shape+3, dataInt_);
    andres::View<int> w(shape, shape+3, dataInt_ + 2);
    for(std::size_t z=0; z<2; ++z) {
        for(std::size_t y=0; y<3; ++y) {
            for(std::size_t x=0; x<2; ++x) {
                test((+v)(x,y,z) == + v(x,y,z));

                test((-v)(x,y,z) == - v(x,y,z));

                test((2+v)(x,y,z) == 2 + v(x,y,z));
                test((v+2)(x,y,z) == v(x,y,z) + 2);
                test((v+w)(x,y,z) == v(x,y,z) + w(x,y,z));

                test((2-v)(x,y,z) == 2 - v(x,y,z));
                test((v-2)(x,y,z) == v(x,y,z) - 2);
                test((v-w)(x,y,z) == v(x,y,z) - w(x,y,z));

                test((2*v)(x,y,z) == 2 * v(x,y,z));
                test((v*2)(x,y,z) == v(x,y,z) * 2);
                test((v*w)(x,y,z) == v(x,y,z) * w(x,y,z));

                test((2/v)(x,y,z) == 2 / v(x,y,z));
                test((v/2)(x,y,z) == v(x,y,z) / 2);
                test((v/w)(x,y,z) == v(x,y,z) / w(x,y,z));

                test((v*v - 2*v*w + w*w)(x,y,z)
                    == v(x,y,z)*v(x,y,z) - 2*v(x,y,z)*w(x,y,z)
                       + w(x,y,z)*w(x,y,z));
            }
        }
    }
}